

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void x86_cpu_reset(CPUState *dev)

{
  CPUX86State *env_00;
  ExtSaveArea *esa;
  TranslationBlock *pTStack_40;
  int i;
  uint64_t xcr0;
  target_ulong cr4;
  CPUX86State *env;
  X86CPUClass *xcc;
  X86CPU *cpu;
  CPUState *s;
  CPUState *dev_local;
  
  env_00 = (CPUX86State *)(dev[1].tb_jmp_cache + 0xeb);
  (*(code *)dev[1].tb_jmp_cache[0x498])(dev);
  memset(env_00,0,0x15a0);
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x396) = 0xffffffff;
  *(uint *)((long)dev[1].tb_jmp_cache + 0x80c) = *(uint *)((long)dev[1].tb_jmp_cache + 0x80c) | 1;
  cpu_x86_update_cr0_x86_64(env_00,0x60000010);
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x125) = 0xffffffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x37c) = 0x30000;
  dev[1].tb_jmp_cache[0x37d] = (TranslationBlock *)0x0;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x11f) = 0xffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x11c) = 0xffff;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x116) = 0xffff;
  *(undefined4 *)((long)dev[1].tb_jmp_cache + 0x8b4) = 0x8200;
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x119) = 0xffff;
  *(undefined4 *)((long)dev[1].tb_jmp_cache + 0x8cc) = 0x8b00;
  cpu_x86_load_seg_cache(env_00,1,0xf000,0xffff0000,0xffff,0x9b00);
  cpu_x86_load_seg_cache(env_00,3,0,0,0xffff,0x9300);
  cpu_x86_load_seg_cache(env_00,0,0,0,0xffff,0x9300);
  cpu_x86_load_seg_cache(env_00,2,0,0,0xffff,0x9300);
  cpu_x86_load_seg_cache(env_00,4,0,0,0xffff,0x9300);
  cpu_x86_load_seg_cache(env_00,5,0,0,0xffff,0x9300);
  dev[1].tb_jmp_cache[0xfb] = (TranslationBlock *)0xfff0;
  dev[1].tb_jmp_cache[0xed] =
       (TranslationBlock *)(ulong)*(uint *)((long)dev[1].tb_jmp_cache + 0x1d34);
  dev[1].tb_jmp_cache[0xfc] = (TranslationBlock *)&DAT_00000002;
  for (esa._4_4_ = 0; (int)esa._4_4_ < 8; esa._4_4_ = esa._4_4_ + 1) {
    *(undefined1 *)((long)dev[1].tb_jmp_cache + (long)(int)esa._4_4_ + 0x99c) = 1;
  }
  cpu_set_fpuc(env_00,0x37f);
  *(undefined4 *)(dev[1].tb_jmp_cache + 0x14d) = 0x1f80;
  dev[1].tb_jmp_cache[0x44c] = (TranslationBlock *)0x0;
  dev[1].tb_jmp_cache[0x37b] = (TranslationBlock *)0x7040600070406;
  dev[1].tb_jmp_cache[0x34e] = (TranslationBlock *)&DAT_00000001;
  if (((ulong)dev[1].tb_jmp_cache[0x3a8] & 8) != 0) {
    dev[1].tb_jmp_cache[0x34e] = (TranslationBlock *)((ulong)dev[1].tb_jmp_cache[0x34e] | 0x40000);
  }
  memset(dev[1].tb_jmp_cache + 0x38a,0,0x40);
  dev[1].tb_jmp_cache[0x390] = (TranslationBlock *)0xffff0ff0;
  dev[1].tb_jmp_cache[0x391] = (TranslationBlock *)0x400;
  cpu_breakpoint_remove_all_x86_64(dev,0x20);
  cpu_watchpoint_remove_all_x86_64(dev,0x20);
  xcr0._0_4_ = 0;
  pTStack_40 = (TranslationBlock *)&DAT_00000001;
  if (((ulong)dev[1].tb_jmp_cache[0x3a7] & 0x2000000) != 0) {
    pTStack_40 = (TranslationBlock *)0x3;
  }
  for (esa._4_4_ = 2; esa._4_4_ < 10; esa._4_4_ = esa._4_4_ + 1) {
    if (((ulong)dev[1].tb_jmp_cache[(ulong)x86_ext_save_areas[(int)esa._4_4_].feature + 0x3a7] &
        (ulong)x86_ext_save_areas[(int)esa._4_4_].bits) != 0) {
      pTStack_40 = (TranslationBlock *)(1L << ((byte)esa._4_4_ & 0x3f) | (ulong)pTStack_40);
    }
  }
  if (((ulong)dev[1].tb_jmp_cache[0x3a8] & 0x4000000) != 0) {
    xcr0._0_4_ = 0x40200;
  }
  if (((ulong)dev[1].tb_jmp_cache[0x3a9] & 1) != 0) {
    xcr0._0_4_ = (uint)xcr0 | 0x10000;
  }
  dev[1].tb_jmp_cache[0x34c] = pTStack_40;
  cpu_x86_update_cr4_x86_64(env_00,(uint)xcr0);
  dev[1].tb_jmp_cache[0x408] = (TranslationBlock *)0x0;
  memset(dev[1].tb_jmp_cache + 0x409,0,0x80);
  memset(dev[1].tb_jmp_cache + 0x3fd,0,0x58);
  return;
}

Assistant:

static void x86_cpu_reset(CPUState *dev)
{
    CPUState *s = CPU(dev);
    X86CPU *cpu = X86_CPU(s);
    X86CPUClass *xcc = X86_CPU_GET_CLASS(cpu);
    CPUX86State *env = &cpu->env;
    target_ulong cr4;
    uint64_t xcr0;
    int i;

    xcc->parent_reset(s);

    memset(env, 0, offsetof(CPUX86State, end_reset_fields));

    env->old_exception = -1;

    /* init to reset state */

    env->hflags2 |= HF2_GIF_MASK;

    cpu_x86_update_cr0(env, 0x60000010);
    env->a20_mask = ~0x0;
    env->smbase = 0x30000;
    env->msr_smi_count = 0;

    env->idt.limit = 0xffff;
    env->gdt.limit = 0xffff;
    env->ldt.limit = 0xffff;
    env->ldt.flags = DESC_P_MASK | (2 << DESC_TYPE_SHIFT);
    env->tr.limit = 0xffff;
    env->tr.flags = DESC_P_MASK | (11 << DESC_TYPE_SHIFT);

    cpu_x86_load_seg_cache(env, R_CS, 0xf000, 0xffff0000, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_CS_MASK |
                           DESC_R_MASK | DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_DS, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_ES, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_SS, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_FS, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);
    cpu_x86_load_seg_cache(env, R_GS, 0, 0, 0xffff,
                           DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                           DESC_A_MASK);

    env->eip = 0xfff0;
    env->regs[R_EDX] = env->cpuid_version;

    env->eflags = 0x2;

    /* FPU init */
    for (i = 0; i < 8; i++) {
        env->fptags[i] = 1;
    }
    cpu_set_fpuc(env, 0x37f);

    env->mxcsr = 0x1f80;
    /* All units are in INIT state.  */
    env->xstate_bv = 0;

    env->pat = 0x0007040600070406ULL;
    env->msr_ia32_misc_enable = MSR_IA32_MISC_ENABLE_DEFAULT;
    if (env->features[FEAT_1_ECX] & CPUID_EXT_MONITOR) {
        env->msr_ia32_misc_enable |= MSR_IA32_MISC_ENABLE_MWAIT;
    }

    memset(env->dr, 0, sizeof(env->dr));
    env->dr[6] = DR6_FIXED_1;
    env->dr[7] = DR7_FIXED_1;
    cpu_breakpoint_remove_all(s, BP_CPU);
    cpu_watchpoint_remove_all(s, BP_CPU);

    cr4 = 0;
    xcr0 = XSTATE_FP_MASK;

    /* Enable all the features for user-mode.  */
    if (env->features[FEAT_1_EDX] & CPUID_SSE) {
        xcr0 |= XSTATE_SSE_MASK;
    }
    for (i = 2; i < ARRAY_SIZE(x86_ext_save_areas); i++) {
        const ExtSaveArea *esa = &x86_ext_save_areas[i];
        if (env->features[esa->feature] & esa->bits) {
            xcr0 |= 1ull << i;
        }
    }

    if (env->features[FEAT_1_ECX] & CPUID_EXT_XSAVE) {
        cr4 |= CR4_OSFXSR_MASK | CR4_OSXSAVE_MASK;
    }
    if (env->features[FEAT_7_0_EBX] & CPUID_7_0_EBX_FSGSBASE) {
        cr4 |= CR4_FSGSBASE_MASK;
    }

    env->xcr0 = xcr0;
    cpu_x86_update_cr4(env, cr4);

    /*
     * SDM 11.11.5 requires:
     *  - IA32_MTRR_DEF_TYPE MSR.E = 0
     *  - IA32_MTRR_PHYSMASKn.V = 0
     * All other bits are undefined.  For simplification, zero it all.
     */
    env->mtrr_deftype = 0;
    memset(env->mtrr_var, 0, sizeof(env->mtrr_var));
    memset(env->mtrr_fixed, 0, sizeof(env->mtrr_fixed));
}